

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall
Win32MakefileGenerator::writeObjectsPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QTextStream *this_00;
  QTextStream *in_RSI;
  QMakeProject *in_RDI;
  long in_FS_OFFSET;
  ProKey *v;
  MakefileGenerator *this_01;
  QMakeProject *varList;
  MakefileGenerator *in_stack_ffffffffffffff98;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  varList = in_RDI;
  this_00 = (QTextStream *)QTextStream::operator<<(in_RSI,"OBJECTS       = ");
  v = (ProKey *)(in_RDI->super_QMakeEvaluator).m_superfile.d.size;
  this_01 = (MakefileGenerator *)&stack0xffffffffffffff98;
  ProKey::ProKey((ProKey *)in_RDI,(char *)v);
  QMakeProject::values(in_RDI,v);
  MakefileGenerator::escapeDependencyPaths(this_01,(ProStringList *)&stack0xffffffffffffffc8);
  MakefileGenerator::valList(in_stack_ffffffffffffff98,(ProStringList *)varList);
  QTextStream::operator<<(this_00,(QString *)&stack0xffffffffffffffe0);
  ::operator<<((QTextStream *)in_RDI,(QTextStreamFunction)v);
  QString::~QString((QString *)0x2b8338);
  ProStringList::~ProStringList((ProStringList *)0x2b8342);
  ProKey::~ProKey((ProKey *)0x2b834c);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeObjectsPart(QTextStream &t)
{
    // Used in both deps and commands.
    t << "OBJECTS       = " << valList(escapeDependencyPaths(project->values("OBJECTS"))) << Qt::endl;
}